

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImBoolVector::SetBit(ImBoolVector *this,int n,bool v)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  undefined7 in_register_00000011;
  
  uVar2 = 1 << ((byte)n & 0x1f);
  iVar3 = n >> 5;
  if ((int)CONCAT71(in_register_00000011,v) == 0) {
    if (*(int *)this <= iVar3) goto LAB_00144ccd;
    puVar1 = (uint *)(*(long *)(this + 8) + (long)iVar3 * 4);
    *puVar1 = *puVar1 & ~uVar2;
  }
  else {
    if (*(int *)this <= iVar3) {
LAB_00144ccd:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4e6,"T &ImVector<int>::operator[](int) [T = int]");
    }
    puVar1 = (uint *)(*(long *)(this + 8) + (long)iVar3 * 4);
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void            SetBit(int n, bool v)   { int off = (n >> 5); int mask = 1 << (n & 31); if (v) Storage[off] |= mask; else Storage[off] &= ~mask; }